

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_heresiarch.cpp
# Opt level: O2

int AF_A_SorcFX2Split(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  PClassActor *pPVar3;
  AActor *pAVar4;
  FState *pFVar5;
  DObject *this_00;
  char *__assertion;
  FName local_40;
  FName local_3c;
  DVector3 local_38;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0053ca90;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = (DObject *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (DObject *)0x0) {
LAB_0053c8e1:
        this_00 = (DObject *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0053ca90;
        }
      }
      if (numparam == 1) goto LAB_0053c961;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0053ca80;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0053ca90;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0053ca80;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0053c961:
        pPVar3 = (PClassActor *)DObject::GetClass(this_00);
        local_38.X = *(double *)&this_00[1].ObjectFlags;
        local_38.Y = (double)this_00[2]._vptr_DObject;
        local_38.Z = (double)this_00[2].Class;
        pAVar4 = Spawn(pPVar3,&local_38,NO_REPLACE);
        if (pAVar4 != (AActor *)0x0) {
          (pAVar4->target).field_0 =
               *(anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)&this_00[0xb].ObjectFlags;
          pAVar4->args[0] = 0;
          pAVar4->specialf1 = (double)this_00[3].GCNext;
          FName::FName(&local_3c,"Orbit");
          pFVar5 = AActor::FindState(pAVar4,&local_3c);
          AActor::SetState(pAVar4,pFVar5,false);
        }
        pPVar3 = (PClassActor *)DObject::GetClass(this_00);
        local_38.X = *(double *)&this_00[1].ObjectFlags;
        local_38.Y = (double)this_00[2]._vptr_DObject;
        local_38.Z = (double)this_00[2].Class;
        pAVar4 = Spawn(pPVar3,&local_38,NO_REPLACE);
        if (pAVar4 != (AActor *)0x0) {
          (pAVar4->target).field_0 =
               *(anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)&this_00[0xb].ObjectFlags;
          pAVar4->args[0] = 1;
          pAVar4->specialf1 = (double)this_00[3].GCNext;
          FName::FName(&local_40,"Orbit");
          pFVar5 = AActor::FindState(pAVar4,&local_40);
          AActor::SetState(pAVar4,pFVar5,false);
        }
        (*this_00->_vptr_DObject[4])(this_00);
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0053ca90;
    }
    if (this_00 == (DObject *)0x0) goto LAB_0053c8e1;
  }
LAB_0053ca80:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0053ca90:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                ,0x2ed,"int AF_A_SorcFX2Split(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SorcFX2Split)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;

	mo = Spawn(self->GetClass(), self->Pos(), NO_REPLACE);
	if (mo)
	{
		mo->target = self->target;
		mo->args[0] = 0;									// CW
		mo->specialf1 = self->Angles.Yaw.Degrees;			// Set angle
		mo->SetState (mo->FindState("Orbit"));
	}
	mo = Spawn(self->GetClass(), self->Pos(), NO_REPLACE);
	if (mo)
	{
		mo->target = self->target;
		mo->args[0] = 1;									// CCW
		mo->specialf1 = self->Angles.Yaw.Degrees;			// Set angle
		mo->SetState (mo->FindState("Orbit"));
	}
	self->Destroy ();
	return 0;
}